

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressBlock_greedy
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ZSTD_compressionParameters *cParams;
  int *pInLimit;
  int *piVar1;
  int *ilimit_w;
  undefined8 *puVar2;
  uint uVar3;
  uint uVar4;
  U32 *pUVar5;
  BYTE *pBVar6;
  undefined8 uVar7;
  uint uVar8;
  U32 UVar9;
  BYTE *pBVar10;
  size_t sVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  uint uVar18;
  BYTE *pBVar19;
  long lVar20;
  int *ip;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  U32 UVar24;
  seqDef *psVar25;
  bool bVar26;
  uint local_cc;
  int *local_b0;
  ulong local_a0;
  
  pInLimit = (int *)((long)src + srcSize);
  pBVar10 = (ms->window).base + (ms->window).dictLimit;
  uVar3 = rep[1];
  iVar16 = (int)pBVar10;
  ip = (int *)((ulong)((int)src == iVar16) + (long)src);
  uVar18 = (int)ip - iVar16;
  local_cc = uVar3;
  if (uVar18 < uVar3) {
    local_cc = 0;
  }
  piVar1 = (int *)((long)src + (srcSize - 8));
  uVar4 = *rep;
  uVar17 = (ulong)uVar4;
  if (uVar18 < uVar4) {
    uVar17 = 0;
  }
  ilimit_w = (int *)((long)src + (srcSize - 0x20));
  cParams = &ms->cParams;
  local_b0 = (int *)src;
LAB_001106ec:
  uVar15 = (uint)uVar17;
  do {
    if (piVar1 <= ip) {
      uVar8 = 0;
      if (uVar18 < uVar3) {
        uVar8 = uVar3;
      }
      if (uVar18 < uVar4) {
        uVar8 = uVar4;
      }
      if (uVar15 == 0) {
        uVar15 = uVar8;
      }
      if (local_cc != 0) {
        uVar8 = local_cc;
      }
      *rep = uVar15;
      rep[1] = uVar8;
      return (long)pInLimit - (long)local_b0;
    }
    if ((uVar15 != 0) && (*(int *)((long)ip + -uVar17 + 1) == *(int *)((long)ip + 1))) {
      sVar11 = ZSTD_count((BYTE *)((long)ip + 5),(BYTE *)((long)ip + -uVar17 + 5),(BYTE *)pInLimit);
      uVar23 = sVar11 + 4;
      ip = (int *)((long)ip + 1);
      goto LAB_00110b55;
    }
    uVar8 = (ms->cParams).minMatch;
    iVar16 = (int)ip;
    if (uVar8 - 6 < 2) {
      uVar8 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
      pUVar5 = ms->chainTable;
      pBVar6 = (ms->window).base;
      uVar21 = iVar16 - (int)pBVar6;
      uVar12 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      UVar9 = (ms->window).lowLimit;
      UVar24 = uVar21 - uVar12;
      if (uVar21 - UVar9 <= uVar12) {
        UVar24 = UVar9;
      }
      uVar12 = (ms->window).dictLimit;
      if (ms->loadedDictEnd != 0) {
        UVar24 = UVar9;
      }
      uVar13 = uVar21 - uVar8;
      if (uVar21 < uVar8) {
        uVar13 = 0;
      }
      iVar16 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
      UVar9 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip,6);
      local_a0 = 999999999;
      uVar23 = 3;
      while( true ) {
        bVar26 = iVar16 == 0;
        iVar16 = iVar16 + -1;
        if ((UVar9 <= UVar24) || (bVar26)) break;
        if (UVar9 < uVar12) {
LAB_00110e5f:
          __assert_fail("matchIndex >= dictLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x40d8,
                        "size_t ZSTD_HcFindBestMatch_generic(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                       );
        }
        pBVar19 = pBVar6 + UVar9;
        if ((((pBVar19[uVar23] == *(BYTE *)((long)ip + uVar23)) &&
             (sVar11 = ZSTD_count((BYTE *)ip,pBVar19,(BYTE *)pInLimit), uVar23 < sVar11)) &&
            (local_a0 = (ulong)((uVar21 + 2) - UVar9), uVar23 = sVar11,
            (int *)(sVar11 + (long)ip) == pInLimit)) || (UVar9 <= uVar13)) break;
        UVar9 = pUVar5[UVar9 & uVar8 - 1];
      }
    }
    else if (uVar8 == 5) {
      uVar21 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
      pUVar5 = ms->chainTable;
      pBVar6 = (ms->window).base;
      uVar22 = iVar16 - (int)pBVar6;
      uVar13 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      uVar8 = (ms->window).lowLimit;
      uVar12 = uVar22 - uVar13;
      if (uVar22 - uVar8 <= uVar13) {
        uVar12 = uVar8;
      }
      uVar13 = (ms->window).dictLimit;
      if (ms->loadedDictEnd != 0) {
        uVar12 = uVar8;
      }
      uVar8 = uVar22 - uVar21;
      if (uVar22 < uVar21) {
        uVar8 = 0;
      }
      iVar16 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
      UVar9 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip,5);
      local_a0 = 999999999;
      uVar23 = 3;
      while( true ) {
        bVar26 = iVar16 == 0;
        iVar16 = iVar16 + -1;
        if ((UVar9 <= uVar12) || (bVar26)) break;
        if (UVar9 < uVar13) goto LAB_00110e5f;
        pBVar19 = pBVar6 + UVar9;
        if ((((pBVar19[uVar23] == *(BYTE *)((long)ip + uVar23)) &&
             (sVar11 = ZSTD_count((BYTE *)ip,pBVar19,(BYTE *)pInLimit), uVar23 < sVar11)) &&
            (local_a0 = (ulong)((uVar22 + 2) - UVar9), uVar23 = sVar11,
            (int *)(sVar11 + (long)ip) == pInLimit)) || (UVar9 <= uVar8)) break;
        UVar9 = pUVar5[UVar9 & uVar21 - 1];
      }
    }
    else {
      uVar21 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
      pUVar5 = ms->chainTable;
      pBVar6 = (ms->window).base;
      uVar22 = iVar16 - (int)pBVar6;
      uVar13 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      uVar8 = (ms->window).lowLimit;
      uVar12 = uVar22 - uVar13;
      if (uVar22 - uVar8 <= uVar13) {
        uVar12 = uVar8;
      }
      uVar13 = (ms->window).dictLimit;
      if (ms->loadedDictEnd != 0) {
        uVar12 = uVar8;
      }
      uVar8 = uVar22 - uVar21;
      if (uVar22 < uVar21) {
        uVar8 = 0;
      }
      iVar16 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
      UVar9 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip,4);
      local_a0 = 999999999;
      uVar23 = 3;
      while( true ) {
        bVar26 = iVar16 == 0;
        iVar16 = iVar16 + -1;
        if ((UVar9 <= uVar12) || (bVar26)) break;
        if (UVar9 < uVar13) goto LAB_00110e5f;
        pBVar19 = pBVar6 + UVar9;
        if ((((pBVar19[uVar23] == *(BYTE *)((long)ip + uVar23)) &&
             (sVar11 = ZSTD_count((BYTE *)ip,pBVar19,(BYTE *)pInLimit), uVar23 < sVar11)) &&
            (local_a0 = (ulong)((uVar22 + 2) - UVar9), uVar23 = sVar11,
            (int *)(sVar11 + (long)ip) == pInLimit)) || (UVar9 <= uVar8)) break;
        UVar9 = pUVar5[UVar9 & uVar21 - 1];
      }
    }
    if (3 < uVar23) break;
    ip = (int *)((long)ip + ((long)ip - (long)local_b0 >> 8) + 1);
  } while( true );
  if (local_a0 == 0) {
LAB_00110b55:
    UVar9 = 1;
  }
  else {
    for (; ((local_b0 < ip && (pBVar10 < (BYTE *)((long)ip + (2 - local_a0)))) &&
           (*(char *)((long)ip + -1) == *(char *)((long)ip + (1 - local_a0))));
        ip = (int *)((long)ip + -1)) {
      uVar23 = uVar23 + 1;
    }
    uVar17 = (ulong)((int)local_a0 - 2);
    UVar9 = (int)local_a0 + 1;
    local_cc = uVar15;
  }
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) {
LAB_00110e7e:
    __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x2038,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (0x20000 < seqStore->maxNbLit) {
LAB_00110e9d:
    __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x203a,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  uVar14 = (long)ip - (long)local_b0;
  pBVar6 = seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < pBVar6 + uVar14) {
LAB_00110ebc:
    __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x203b,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (pInLimit < ip) {
LAB_00110edb:
    __assert_fail("literals + litLength <= litLimit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x203c,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (ilimit_w < ip) {
    ZSTD_safecopyLiterals(pBVar6,(BYTE *)local_b0,(BYTE *)ip,(BYTE *)ilimit_w);
  }
  else {
    uVar7 = *(undefined8 *)(local_b0 + 2);
    *(undefined8 *)pBVar6 = *(undefined8 *)local_b0;
    *(undefined8 *)(pBVar6 + 8) = uVar7;
    pBVar6 = seqStore->lit;
    if (uVar14 < 0x11) {
      seqStore->lit = pBVar6 + uVar14;
      goto LAB_00110c4d;
    }
    lVar20 = (long)(pBVar6 + 0x10) - (long)(local_b0 + 4);
    if (lVar20 < 8) {
      if (-0x10 < lVar20) {
        __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x1268,
                      "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)");
      }
    }
    else if (0xffffffffffffffe0 < lVar20 - 0x10U) {
      __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x1270,
                    "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)");
    }
    uVar7 = *(undefined8 *)(local_b0 + 6);
    *(undefined8 *)(pBVar6 + 0x10) = *(undefined8 *)(local_b0 + 4);
    *(undefined8 *)(pBVar6 + 0x18) = uVar7;
    if (0x20 < (long)uVar14) {
      lVar20 = 0;
      do {
        puVar2 = (undefined8 *)((long)local_b0 + lVar20 + 0x20);
        uVar7 = puVar2[1];
        pBVar19 = pBVar6 + lVar20 + 0x20;
        *(undefined8 *)pBVar19 = *puVar2;
        *(undefined8 *)(pBVar19 + 8) = uVar7;
        puVar2 = (undefined8 *)((long)local_b0 + lVar20 + 0x30);
        uVar7 = puVar2[1];
        *(undefined8 *)(pBVar19 + 0x10) = *puVar2;
        *(undefined8 *)(pBVar19 + 0x18) = uVar7;
        lVar20 = lVar20 + 0x20;
      } while (pBVar19 + 0x20 < pBVar6 + uVar14);
    }
  }
  seqStore->lit = seqStore->lit + uVar14;
  if (0xffff < uVar14) {
    if (seqStore->longLengthID != 0) {
      __assert_fail("seqStorePtr->longLengthID == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x204d,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    seqStore->longLengthID = 1;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
LAB_00110c4d:
  psVar25 = seqStore->sequences;
  psVar25->litLength = (U16)uVar14;
  psVar25->offset = UVar9;
  if (0xffff < uVar23 - 3) {
    if (seqStore->longLengthID != 0) {
LAB_00110efa:
      __assert_fail("seqStorePtr->longLengthID == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x2058,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    seqStore->longLengthID = 2;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
  }
  psVar25->matchLength = (U16)(uVar23 - 3);
  psVar25 = psVar25 + 1;
  seqStore->sequences = psVar25;
  for (ip = (int *)((long)ip + uVar23);
      ((local_b0 = ip, local_cc != 0 && (ip <= piVar1)) &&
      (*ip == *(int *)((long)ip - (ulong)local_cc))); ip = (int *)((long)ip + sVar11 + 4)) {
    sVar11 = ZSTD_count((BYTE *)(ip + 1),(BYTE *)((long)ip + (4 - (ulong)local_cc)),(BYTE *)pInLimit
                       );
    if (seqStore->maxNbSeq <= (ulong)((long)psVar25 - (long)seqStore->sequencesStart >> 3))
    goto LAB_00110e7e;
    if (0x20000 < seqStore->maxNbLit) goto LAB_00110e9d;
    pBVar6 = seqStore->lit;
    if (seqStore->litStart + seqStore->maxNbLit < pBVar6) goto LAB_00110ebc;
    if (pInLimit < ip) goto LAB_00110edb;
    if (ilimit_w < ip) {
      ZSTD_safecopyLiterals(pBVar6,(BYTE *)ip,(BYTE *)ip,(BYTE *)ilimit_w);
    }
    else {
      uVar7 = *(undefined8 *)(ip + 2);
      *(undefined8 *)pBVar6 = *(undefined8 *)ip;
      *(undefined8 *)(pBVar6 + 8) = uVar7;
    }
    psVar25 = seqStore->sequences;
    psVar25->litLength = 0;
    psVar25->offset = 1;
    if (0xffff < sVar11 + 1) {
      if (seqStore->longLengthID != 0) goto LAB_00110efa;
      seqStore->longLengthID = 2;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar25->matchLength = (U16)(sVar11 + 1);
    psVar25 = psVar25 + 1;
    seqStore->sequences = psVar25;
    uVar15 = (uint)uVar17;
    uVar17 = (ulong)local_cc;
    local_cc = uVar15;
  }
  goto LAB_001106ec;
}

Assistant:

size_t ZSTD_compressBlock_greedy(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 0, ZSTD_noDict);
}